

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveDisplayer.cpp
# Opt level: O2

PrimitiveDisplayer * PrimitiveDisplayer::getInstance(void)

{
  PrimitiveDisplayer *this;
  
  if (primitiveDisplayer == (PrimitiveDisplayer *)0x0) {
    this = (PrimitiveDisplayer *)operator_new(0x10);
    PrimitiveDisplayer(this,30.0);
    primitiveDisplayer = this;
  }
  return primitiveDisplayer;
}

Assistant:

PrimitiveDisplayer* PrimitiveDisplayer::getInstance() {
    if (primitiveDisplayer == nullptr) {
        primitiveDisplayer = new PrimitiveDisplayer(30);
    }
    return primitiveDisplayer;
}